

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<spirv_cross::Variant,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::Variant,_8UL>::operator=
          (SmallVector<spirv_cross::Variant,_8UL> *this,
          SmallVector<spirv_cross::Variant,_8UL> *other)

{
  Variant *__ptr;
  ulong uVar1;
  size_t sVar2;
  Variant *pVVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  
  clear(this);
  pVVar3 = (other->super_VectorView<spirv_cross::Variant>).ptr;
  if (pVVar3 == (Variant *)&other->stack_storage) {
    reserve(this,(other->super_VectorView<spirv_cross::Variant>).buffer_size);
    lVar5 = 0;
    for (uVar4 = 0; uVar1 = (other->super_VectorView<spirv_cross::Variant>).buffer_size,
        uVar4 < uVar1; uVar4 = uVar4 + 1) {
      Variant::Variant((Variant *)
                       ((long)&((this->super_VectorView<spirv_cross::Variant>).ptr)->group + lVar5),
                       (Variant *)
                       ((long)&((other->super_VectorView<spirv_cross::Variant>).ptr)->group + lVar5)
                      );
      Variant::~Variant((Variant *)
                        ((long)&((other->super_VectorView<spirv_cross::Variant>).ptr)->group + lVar5
                        ));
      lVar5 = lVar5 + 0x18;
    }
    (this->super_VectorView<spirv_cross::Variant>).buffer_size = uVar1;
    (other->super_VectorView<spirv_cross::Variant>).buffer_size = 0;
  }
  else {
    __ptr = (this->super_VectorView<spirv_cross::Variant>).ptr;
    if (__ptr != (Variant *)&this->stack_storage) {
      free(__ptr);
      pVVar3 = (other->super_VectorView<spirv_cross::Variant>).ptr;
    }
    (this->super_VectorView<spirv_cross::Variant>).ptr = pVVar3;
    sVar2 = other->buffer_capacity;
    (this->super_VectorView<spirv_cross::Variant>).buffer_size =
         (other->super_VectorView<spirv_cross::Variant>).buffer_size;
    this->buffer_capacity = sVar2;
    (other->super_VectorView<spirv_cross::Variant>).ptr = (Variant *)0x0;
    (other->super_VectorView<spirv_cross::Variant>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}